

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_runQuiet(void *highs)

{
  HighsStatus HVar1;
  Highs *in_RDI;
  undefined1 in_stack_ffffffffffffff3f;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  string *in_stack_ffffffffffffff50;
  allocator *paVar2;
  string *method_name;
  allocator local_89;
  string local_88 [39];
  undefined1 local_61 [56];
  allocator local_29;
  string local_28 [32];
  Highs *local_8;
  
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"Highs_runQuiet",&local_29);
  method_name = (string *)local_61;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_61 + 1),"None",(allocator *)method_name);
  Highs::deprecationMessage(in_RDI,method_name,in_stack_ffffffffffffff50);
  std::__cxx11::string::~string((string *)(local_61 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_61);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  paVar2 = &local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"output_flag",paVar2);
  HVar1 = Highs::setOptionValue
                    (local_8,(string *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)
                     ,(bool)in_stack_ffffffffffffff3f);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  return HVar1;
}

Assistant:

HighsInt Highs_runQuiet(void* highs) {
  ((Highs*)highs)->deprecationMessage("Highs_runQuiet", "None");
  return (HighsInt)((Highs*)highs)->setOptionValue("output_flag", false);
}